

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O0

void Cmd_bench(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  printstats = 1;
  bVar1 = FBoolCVar::operator_cast_to_bool(&vid_fps);
  if (bVar1) {
    if (ConsoleState == c_up) {
      waitstart = I_MSTime();
    }
    switchfps = false;
  }
  else {
    FBoolCVar::operator=(&vid_fps,true);
    waitstart = I_MSTime();
    switchfps = true;
  }
  C_HideConsole();
  return;
}

Assistant:

CCMD(bench)
{
	printstats = true;
	if (vid_fps == 0) 
	{
		vid_fps = 1;
		waitstart = I_MSTime();
		switchfps = true;
	}
	else
	{
		if (ConsoleState == c_up) waitstart = I_MSTime();
		switchfps = false;
	}
	C_HideConsole ();
}